

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pNtk_00;
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_60;
  int local_30;
  int i;
  int fAcyclic;
  Abc_Obj_t *pFanin;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode_local;
  
  pNtk_00 = pNode->pNtk;
  iVar2 = Abc_ObjIsNet(pNode);
  if (iVar2 != 0) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x672,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
  }
  iVar2 = Abc_ObjIsPi(pNode);
  if (((iVar2 == 0) && (iVar2 = Abc_ObjIsLatch(pNode), iVar2 == 0)) &&
     (iVar2 = Abc_ObjIsBlackbox(pNode), iVar2 == 0)) {
    iVar2 = Abc_ObjIsNode(pNode);
    if ((iVar2 == 0) && (iVar2 = Abc_ObjIsBox(pNode), iVar2 == 0)) {
      __assert_fail("Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,0x675,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
    }
    iVar2 = Abc_NodeIsTravIdPrevious(pNode);
    if (iVar2 != 0) {
      __assert_fail("!Abc_NodeIsTravIdPrevious(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,0x677,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
    }
    iVar2 = Abc_NodeIsTravIdCurrent(pNode);
    pFVar1 = _stdout;
    if (iVar2 == 0) {
      Abc_NodeSetTravIdCurrent(pNode);
      for (local_30 = 0; iVar2 = Abc_ObjFaninNum(pNode), local_30 < iVar2; local_30 = local_30 + 1)
      {
        _i = Abc_ObjFanin(pNode,local_30);
        iVar2 = Abc_ObjIsBox(pNode);
        if (iVar2 != 0) {
          _i = Abc_ObjFanin0(_i);
        }
        _i = Abc_ObjFanin0Ntk(_i);
        iVar2 = Abc_ObjIsBo(_i);
        if (iVar2 != 0) {
          _i = Abc_ObjFanin0(_i);
        }
        iVar2 = Abc_ObjIsPi(_i);
        if (((iVar2 == 0) && (iVar2 = Abc_ObjIsLatch(_i), iVar2 == 0)) &&
           (iVar2 = Abc_ObjIsBlackbox(_i), iVar2 == 0)) {
          iVar2 = Abc_ObjIsNode(_i);
          if ((iVar2 == 0) && (iVar2 = Abc_ObjIsBox(_i), iVar2 == 0)) {
            __assert_fail("Abc_ObjIsNode(pFanin) || Abc_ObjIsBox(pFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                          ,0x68f,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
          }
          iVar2 = Abc_NodeIsTravIdPrevious(_i);
          if ((iVar2 == 0) &&
             (iVar2 = Abc_NtkIsAcyclicWithBoxes_rec(_i), pFVar1 = _stdout, iVar2 == 0)) {
            iVar2 = Abc_ObjIsBox(_i);
            if (iVar2 == 0) {
              local_60 = Abc_ObjFanout0(_i);
            }
            else {
              local_60 = _i;
            }
            pcVar3 = Abc_ObjName(local_60);
            fprintf(pFVar1," %s ->",pcVar3);
            return 0;
          }
        }
      }
      iVar2 = Abc_ObjIsNode(pNode);
      if ((iVar2 == 0) && (iVar2 = Abc_ObjIsBox(pNode), iVar2 == 0)) {
        __assert_fail("Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                      ,0x69a,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
      }
      Abc_NodeSetTravIdPrevious(pNode);
      pNode_local._4_4_ = 1;
    }
    else {
      pcVar3 = Abc_NtkName(pNtk_00);
      fprintf(pFVar1,"Network \"%s\" contains combinational loop!\n",pcVar3);
      iVar2 = Abc_ObjIsBox(pNode);
      pFVar1 = _stdout;
      if (iVar2 == 0) {
        pObj = Abc_ObjFanout0(pNode);
        pcVar3 = Abc_ObjName(pObj);
        fprintf(pFVar1,"Node \"%s\" is encountered twice on the following path to the COs:\n",pcVar3
               );
      }
      else {
        pcVar3 = Abc_ObjName(pNode);
        fprintf(pFVar1,"Box \"%s\" is encountered twice on the following path to the COs:\n",pcVar3)
        ;
      }
      pNode_local._4_4_ = 0;
    }
  }
  else {
    pNode_local._4_4_ = 1;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NtkIsAcyclicWithBoxes_rec( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    Abc_Obj_t * pFanin;
    int fAcyclic, i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsPi(pNode) || Abc_ObjIsLatch(pNode) || Abc_ObjIsBlackbox(pNode) )
        return 1;
    assert( Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode) );
    // make sure the node is not visited
    assert( !Abc_NodeIsTravIdPrevious(pNode) );
    // check if the node is part of the combinational loop
    if ( Abc_NodeIsTravIdCurrent(pNode) )
    {
        fprintf( stdout, "Network \"%s\" contains combinational loop!\n", Abc_NtkName(pNtk) );
        if ( Abc_ObjIsBox(pNode) )
            fprintf( stdout, "Box \"%s\" is encountered twice on the following path to the COs:\n", Abc_ObjName(pNode) );
        else
            fprintf( stdout, "Node \"%s\" is encountered twice on the following path to the COs:\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        return 0;
    }
    // mark this node as a node on the current path
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    Abc_ObjForEachFanin( pNode, pFanin, i )
    { 
        if ( Abc_ObjIsBox(pNode) )
            pFanin = Abc_ObjFanin0(pFanin);
        pFanin = Abc_ObjFanin0Ntk(pFanin);
        if ( Abc_ObjIsBo(pFanin) )
            pFanin = Abc_ObjFanin0(pFanin);
        // check if the fanin is visited
        if ( Abc_ObjIsPi(pFanin) || Abc_ObjIsLatch(pFanin) || Abc_ObjIsBlackbox(pFanin) )
            continue;
        assert( Abc_ObjIsNode(pFanin) || Abc_ObjIsBox(pFanin) );
        if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
            continue;
        // traverse the fanin's cone searching for the loop
        if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pFanin)) )
            continue;
        // return as soon as the loop is detected
        fprintf( stdout, " %s ->", Abc_ObjName( Abc_ObjIsBox(pFanin) ? pFanin : Abc_ObjFanout0(pFanin) ) );
        return 0;
    }
    // mark this node as a visited node
    assert( Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode) );
    Abc_NodeSetTravIdPrevious( pNode );
    return 1;
}